

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ED.cpp
# Opt level: O0

ED * __thiscall ED::getGradImage(ED *this)

{
  long in_RSI;
  _OutputArray local_60;
  _InputArray local_38;
  undefined1 local_19;
  ED *this_local;
  Mat *result8UC1;
  
  local_19 = 0;
  this_local = this;
  cv::Mat::Mat((Mat *)this);
  cv::_InputArray::_InputArray(&local_38,(Mat *)(in_RSI + 0x1a0));
  cv::_OutputArray::_OutputArray(&local_60,(Mat *)this);
  cv::convertScaleAbs(&local_38,&local_60,1.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_60);
  cv::_InputArray::~_InputArray(&local_38);
  return this;
}

Assistant:

Mat ED::getGradImage()
{	
	Mat result8UC1;
	convertScaleAbs(gradImage, result8UC1);
	
	return result8UC1;
}